

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[92],char_const*,char[31],char_const*,char[38]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [92],char **RestArgs,char (*RestArgs_1) [31],char **RestArgs_2,
               char (*RestArgs_3) [38])

{
  char (*RestArgs_local_3) [38];
  char **RestArgs_local_2;
  char (*RestArgs_local_1) [31];
  char **RestArgs_local;
  char (*FirstArg_local) [92];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[92]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[31],char_const*,char[38]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}